

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

action __thiscall
Search::search::predictLDF
          (search *this,example *ecs,size_t ec_cnt,ptag mytag,action *oracle_actions,
          size_t oracle_actions_cnt,ptag *condition_on,char *condition_on_names,size_t learner_id,
          float weight)

{
  pointer *ppuVar1;
  uint uVar2;
  iterator __position;
  action_repr *paVar3;
  features *this_00;
  features *pfVar4;
  wclass *pwVar5;
  size_t sVar6;
  search_private *psVar7;
  action *pos;
  float loss;
  action_repr item;
  action a;
  float a_cost;
  action local_4c;
  Search *local_48;
  features *local_40;
  float local_34;
  
  local_34 = 0.0;
  pos = oracle_actions;
  local_4c = search_predict(this->priv,ecs,ec_cnt,mytag,oracle_actions,oracle_actions_cnt,
                            condition_on,condition_on_names,(action *)0x0,0,(float *)0x0,learner_id,
                            &local_34,condition_on._0_4_);
  psVar7 = this->priv;
  if (psVar7->state == INIT_TEST) {
    __position._M_current =
         (psVar7->test_action_sequence).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (psVar7->test_action_sequence).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&psVar7->test_action_sequence,
                 __position,&local_4c);
    }
    else {
      *__position._M_current = local_4c;
      ppuVar1 = &(psVar7->test_action_sequence).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if ((mytag != 0) &&
     (pwVar5 = ecs[local_4c].l.cs.costs._begin, ecs[local_4c].l.cs.costs._end != pwVar5)) {
    pfVar4 = (features *)(ulong)mytag;
    psVar7 = this->priv;
    paVar3 = (psVar7->ptag_to_action)._begin;
    local_40 = pfVar4;
    if (pfVar4 < (features *)((long)(psVar7->ptag_to_action)._end - (long)paVar3 >> 4)) {
      this_00 = paVar3[(long)pfVar4].repr;
      if (this_00 != (features *)0x0) {
        features::delete_v(this_00);
        operator_delete((this->priv->ptag_to_action)._begin[(long)pfVar4].repr);
        psVar7 = this->priv;
        pwVar5 = ecs[local_4c].l.cs.costs._begin;
      }
    }
    local_48 = (Search *)&psVar7->ptag_to_action;
    uVar2 = pwVar5->class_index;
    pfVar4 = (features *)operator_new(0x68);
    (pfVar4->values)._begin = (float *)0x0;
    (pfVar4->values)._end = (float *)0x0;
    (pfVar4->values).end_array = (float *)0x0;
    (pfVar4->values).erase_count = 0;
    (pfVar4->indicies)._begin = (unsigned_long *)0x0;
    (pfVar4->indicies)._end = (unsigned_long *)0x0;
    (pfVar4->indicies).end_array = (unsigned_long *)0x0;
    (pfVar4->indicies).erase_count = 0;
    (pfVar4->space_names)._begin =
         (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (pfVar4->space_names)._end =
         (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (pfVar4->space_names).end_array =
         (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (pfVar4->space_names).erase_count = 0;
    pfVar4->sum_feat_sq = 0.0;
    features::deep_copy_from(pfVar4,&psVar7->last_action_repr);
    item.repr = local_40;
    item._0_8_ = pfVar4;
    push_at<Search::action_repr>
              (local_48,(v_array<Search::action_repr> *)(ulong)uVar2,item,(size_t)pos);
  }
  if (this->priv->auto_hamming_loss == true) {
    loss = 0.0;
    if (oracle_actions_cnt != 0) {
      sVar6 = 0;
      do {
        if (oracle_actions[sVar6] == local_4c) goto LAB_0025fe87;
        sVar6 = sVar6 + 1;
      } while (oracle_actions_cnt != sVar6);
      loss = 1.0;
    }
LAB_0025fe87:
    search_declare_loss(this->priv,loss);
  }
  return local_4c;
}

Assistant:

action search::predictLDF(example* ecs, size_t ec_cnt, ptag mytag, const action* oracle_actions,
    size_t oracle_actions_cnt, const ptag* condition_on, const char* condition_on_names, size_t learner_id,
    float weight)
{
  float a_cost = 0.;
  // TODO: action costs for ldf
  action a = search_predict(*priv, ecs, ec_cnt, mytag, oracle_actions, oracle_actions_cnt, condition_on,
      condition_on_names, nullptr, 0, nullptr, learner_id, a_cost, weight);
  if (priv->state == INIT_TEST)
    priv->test_action_sequence.push_back(a);
  if ((mytag != 0) && ecs[a].l.cs.costs.size() > 0)
  {
    if (mytag < priv->ptag_to_action.size())
    {
      cdbg << "delete_v at " << mytag << endl;
      if (priv->ptag_to_action[mytag].repr != nullptr)
      {
        priv->ptag_to_action[mytag].repr->delete_v();
        delete priv->ptag_to_action[mytag].repr;
      }
    }
    push_at(priv->ptag_to_action, action_repr(ecs[a].l.cs.costs[0].class_index, &(priv->last_action_repr)), mytag);
  }
  if (priv->auto_hamming_loss)
    loss(action_hamming_loss(a, oracle_actions, oracle_actions_cnt));  // TODO: action costs
  cdbg << "predict returning " << a << endl;
  return a;
}